

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

UHashtable *
icu_63::CollationElementIterator::computeMaxExpansions(CollationData *data,UErrorCode *errorCode)

{
  UBool UVar1;
  ContractionsAndExpansions local_260;
  undefined1 local_40 [8];
  MaxExpSink sink;
  UHashtable *maxExpansions;
  UErrorCode *errorCode_local;
  CollationData *data_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    sink.errorCode =
         (UErrorCode *)
         uhash_open_63(uhash_hashLong_63,uhash_compareLong_63,uhash_compareLong_63,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 == '\0') {
      anon_unknown_16::MaxExpSink::MaxExpSink
                ((MaxExpSink *)local_40,(UHashtable *)sink.errorCode,errorCode);
      ContractionsAndExpansions::ContractionsAndExpansions
                (&local_260,(UnicodeSet *)0x0,(UnicodeSet *)0x0,(CESink *)local_40,'\x01');
      ContractionsAndExpansions::forData(&local_260,data,errorCode);
      ContractionsAndExpansions::~ContractionsAndExpansions(&local_260);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        data_local = (CollationData *)sink.errorCode;
      }
      else {
        uhash_close_63((UHashtable *)sink.errorCode);
        data_local = (CollationData *)0x0;
      }
      anon_unknown_16::MaxExpSink::~MaxExpSink((MaxExpSink *)local_40);
    }
    else {
      data_local = (CollationData *)0x0;
    }
  }
  else {
    data_local = (CollationData *)0x0;
  }
  return (UHashtable *)data_local;
}

Assistant:

UHashtable *
CollationElementIterator::computeMaxExpansions(const CollationData *data, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return NULL; }
    UHashtable *maxExpansions = uhash_open(uhash_hashLong, uhash_compareLong,
                                           uhash_compareLong, &errorCode);
    if (U_FAILURE(errorCode)) { return NULL; }
    MaxExpSink sink(maxExpansions, errorCode);
    ContractionsAndExpansions(NULL, NULL, &sink, TRUE).forData(data, errorCode);
    if (U_FAILURE(errorCode)) {
        uhash_close(maxExpansions);
        return NULL;
    }
    return maxExpansions;
}